

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O3

void pop_heap_suite::pop_decreasing(void)

{
  array<int,_4UL> expect;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38 [2];
  
  local_48 = 0x2c;
  iStack_44 = 0x21;
  uStack_40 = 0x16;
  uStack_3c = 0xb;
  vista::pop_heap<false,int*,std::less<int>>(&local_48,local_38);
  uStack_3c = 0;
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0xb;
  expect._M_elems[2] = 0x16;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x275,"void pop_heap_suite::pop_decreasing()",&local_48,local_38,expect._M_elems,
             &local_48);
  vista::pop_heap<false,int*,std::less<int>>(&local_48,&uStack_3c);
  uStack_40 = 0;
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0xb;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x27c,"void pop_heap_suite::pop_decreasing()",&local_48,local_38,expect._M_elems,
             &local_48);
  local_48 = iStack_44;
  iStack_44 = 0;
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x283,"void pop_heap_suite::pop_decreasing()",&local_48,local_38,expect._M_elems,
             &local_48);
  local_48 = 0;
  expect._M_elems[0] = 0;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x28a,"void pop_heap_suite::pop_decreasing()",&local_48,local_38,expect._M_elems,
             &local_48);
  return;
}

Assistant:

void pop_decreasing()
{
    std::array<int, 4> heap = { 44, 33, 22, 11 }; // Result of push_suite::push_decreasing
    auto last = heap.end();
    vista::pop_heap(heap.begin(), last, std::less<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 33, 11, 22, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::less<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 22, 11, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::less<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 11, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::less<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}